

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xsub.c
# Opt level: O0

int nn_xsub_setopt(nn_sockbase *self,int level,int option,void *optval,size_t optvallen)

{
  int in_EDX;
  int in_ESI;
  nn_trie *in_RDI;
  nn_xsub *xsub;
  int rc;
  nn_trie *in_stack_00000040;
  uint8_t *in_stack_ffffffffffffffb8;
  int local_4;
  
  if (in_RDI == (nn_trie *)0x0) {
    in_RDI = (nn_trie *)0x0;
  }
  if (in_ESI == 0x21) {
    if (in_EDX == 1) {
      local_4 = nn_trie_subscribe(in_stack_00000040,(uint8_t *)self,CONCAT44(level,option));
      if (-1 < local_4) {
        local_4 = 0;
      }
    }
    else if (in_EDX == 2) {
      local_4 = nn_trie_unsubscribe(in_RDI,in_stack_ffffffffffffffb8,0x158639);
      if (-1 < local_4) {
        local_4 = 0;
      }
    }
    else {
      local_4 = -0x5c;
    }
  }
  else {
    local_4 = -0x5c;
  }
  return local_4;
}

Assistant:

static int nn_xsub_setopt (struct nn_sockbase *self, int level, int option,
        const void *optval, size_t optvallen)
{
    int rc;
    struct nn_xsub *xsub;

    xsub = nn_cont (self, struct nn_xsub, sockbase);

    if (level != NN_SUB)
        return -ENOPROTOOPT;

    if (option == NN_SUB_SUBSCRIBE) {
        rc = nn_trie_subscribe (&xsub->trie, optval, optvallen);
        if (rc >= 0)
            return 0;
        return rc;
    }

    if (option == NN_SUB_UNSUBSCRIBE) {
        rc = nn_trie_unsubscribe (&xsub->trie, optval, optvallen);
        if (rc >= 0)
            return 0;
        return rc;
    }

    return -ENOPROTOOPT;
}